

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O1

size_t utf8::DecodeUnitsInto
                 (char16 *buffer,LPCUTF8 *pbUtf8,LPCUTF8 pbEnd,DecodeOptions options,
                 bool *chunkEndsAtTruncatedSequence)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  char16 cVar4;
  uint *puVar5;
  char cVar6;
  char16 *pcVar7;
  LPCUTF8 s;
  DecodeOptions local_3c;
  uint *puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 p;
  
  if (chunkEndsAtTruncatedSequence != (bool *)0x0) {
    *chunkEndsAtTruncatedSequence = false;
  }
  puStack_38 = (uint *)*pbUtf8;
  puVar5 = puStack_38;
  pcVar7 = buffer;
  local_3c = options;
  if ((((uint)puStack_38 | (uint)buffer) & 3) != 0) goto LAB_00155039;
LAB_00154fe6:
  do {
    if ((byte *)((long)puVar5 + 3U) < pbEnd) {
      uVar3 = *puVar5;
      if ((uVar3 & 0x80808080) == 0) {
        *(uint *)pcVar7 = (uVar3 & 0x7f00) << 8 | uVar3 & 0x7f;
        *(uint *)(pcVar7 + 2) = ((uVar3 >> 0x10) << 8 | uVar3 >> 0x10) & 0x7f007f;
        puVar5 = puVar5 + 1;
        pcVar7 = pcVar7 + 4;
        puStack_38 = puVar5;
      }
      if ((uVar3 & 0x80808080) == 0) goto LAB_00154fe6;
    }
LAB_00155039:
    do {
      puVar5 = puStack_38;
      if (pbEnd <= puStack_38) goto LAB_0015509e;
      puVar1 = (uint *)((long)puStack_38 + 1);
      bVar2 = (byte)*puStack_38;
      cVar4 = (char16)bVar2;
      puStack_38 = puVar1;
      if ((char)bVar2 < '\0') {
        cVar4 = DecodeTail((ushort)bVar2,(LPCUTF8 *)&stack0xffffffffffffffc8,pbEnd,&local_3c,
                           chunkEndsAtTruncatedSequence);
      }
      cVar6 = '\a';
      if (puVar5 < puStack_38) {
        *pcVar7 = cVar4;
        pcVar7 = pcVar7 + 1;
        cVar6 = ((((uint)pcVar7 | (uint)puStack_38) & 3) == 0) * '\x03';
      }
    } while (cVar6 == '\0');
    puVar5 = puStack_38;
    if (cVar6 != '\x03') {
LAB_0015509e:
      *pbUtf8 = (LPCUTF8)puStack_38;
      return (long)pcVar7 - (long)buffer >> 1;
    }
  } while( true );
}

Assistant:

_Use_decl_annotations_
    size_t DecodeUnitsInto(char16 *buffer, LPCUTF8& pbUtf8, LPCUTF8 pbEnd, DecodeOptions options, bool *chunkEndsAtTruncatedSequence)
    {
        DecodeOptions localOptions = options;

        if (chunkEndsAtTruncatedSequence)
        {
            *chunkEndsAtTruncatedSequence = false;
        }

        LPCUTF8 p = pbUtf8;
        char16 *dest = buffer;

        if (!ShouldFastPath(p, dest)) goto LSlowPath;

LFastPath:
        while (p + 3 < pbEnd)
        {
            unsigned bytes = *(unsigned *)p;
            if ((bytes & 0x80808080) != 0) goto LSlowPath;
            ((uint32 *)dest)[0] = (char16(bytes) & 0x00FF) | ((char16(bytes) & 0xFF00) << 8);
            ((uint32 *)dest)[1] = (char16(bytes >> 16) & 0x00FF) | ((char16(bytes >> 16) & 0xFF00) << 8);
            p += 4;
            dest += 4;
        }

LSlowPath:
        while (p < pbEnd)
        {
            LPCUTF8 s = p;
            char16 chDest = Decode(p, pbEnd, localOptions, chunkEndsAtTruncatedSequence);

            if (s < p)
            {
                // We decoded the character, store it
                *dest++ = chDest;
            }
            else
            {
                // Nothing was converted. This might happen at the end of a buffer with doChunkedEncoding.
                break;
            }

            if (ShouldFastPath(p, dest)) goto LFastPath;
        }

        pbUtf8 = p;

        return dest - buffer;
    }